

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

PaddingLayerParams_PaddingReflection * __thiscall
CoreML::Specification::PaddingLayerParams::mutable_reflection(PaddingLayerParams *this)

{
  PaddingLayerParams_PaddingConstant *this_00;
  
  if (this->_oneof_case_[0] == 2) {
    this_00 = (this->PaddingType_).constant_;
  }
  else {
    clear_PaddingType(this);
    this->_oneof_case_[0] = 2;
    this_00 = (PaddingLayerParams_PaddingConstant *)operator_new(0x18);
    PaddingLayerParams_PaddingReflection::PaddingLayerParams_PaddingReflection
              ((PaddingLayerParams_PaddingReflection *)this_00);
    (this->PaddingType_).reflection_ = (PaddingLayerParams_PaddingReflection *)this_00;
  }
  return (PaddingLayerParams_PaddingReflection *)this_00;
}

Assistant:

inline ::CoreML::Specification::PaddingLayerParams_PaddingReflection* PaddingLayerParams::mutable_reflection() {
  if (!has_reflection()) {
    clear_PaddingType();
    set_has_reflection();
    PaddingType_.reflection_ = new ::CoreML::Specification::PaddingLayerParams_PaddingReflection;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.PaddingLayerParams.reflection)
  return PaddingType_.reflection_;
}